

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  ImGuiWindowTempData *in_RDI;
  
  IM_DELETE<char>((char *)0x4940ab);
  ImVector<ImGuiOldColumns>::clear_destruct((ImVector<ImGuiOldColumns> *)in_RDI);
  ImDrawList::~ImDrawList((ImDrawList *)in_RDI);
  ImVector<ImGuiOldColumns>::~ImVector((ImVector<ImGuiOldColumns> *)in_RDI);
  ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x4940f3);
  ImGuiWindowTempData::~ImGuiWindowTempData(in_RDI);
  ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)in_RDI);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    ColumnsStorage.clear_destruct();
}